

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger_p.h
# Opt level: O1

bool __thiscall QTestCharBuffer::reset(QTestCharBuffer *this,int newSize,bool copy)

{
  char *__ptr;
  char *pcVar1;
  
  __ptr = this->buf;
  if (__ptr == this->staticBuf) {
    pcVar1 = (char *)malloc((long)newSize);
    if (copy && pcVar1 != (char *)0x0) {
      qstrncpy(pcVar1,__ptr,(long)this->_size);
    }
  }
  else {
    pcVar1 = (char *)realloc(__ptr,(long)newSize);
  }
  if (pcVar1 != (char *)0x0) {
    this->_size = newSize;
    this->buf = pcVar1;
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool reset(int newSize, bool copy = false)
    {
        char *newBuf = nullptr;
        if (buf == staticBuf) {
            // if we point to our internal buffer, we need to malloc first
            newBuf = reinterpret_cast<char *>(malloc(newSize));
            if (copy && newBuf)
                qstrncpy(newBuf, buf, _size);
        } else {
            // if we already malloc'ed, just realloc
            newBuf = reinterpret_cast<char *>(realloc(buf, newSize));
        }

        // if the allocation went wrong (newBuf == 0), we leave the object as is
        if (!newBuf)
            return false;

        _size = newSize;
        buf = newBuf;
        return true;
    }